

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayValue.cpp
# Opt level: O0

void __thiscall ArrayValue::SetAtIndex(ArrayValue *this,Value *value,size_t index)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  PrimitiveSimpleObject *pPVar5;
  size_type sVar6;
  runtime_error *prVar7;
  reference ppVVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t index_local;
  Value *value_local;
  ArrayValue *this_local;
  
  local_20 = index;
  index_local = (size_t)value;
  value_local = &this->super_Value;
  iVar4 = (*value->_vptr_Value[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar4))(&local_40);
  pPVar5 = GetElementType(this);
  (**(pPVar5->super_PrimitiveObject).super_Object._vptr_Object)(&local_60);
  bVar3 = std::operator!=(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  sVar1 = local_20;
  if (bVar3) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Trying to set value of another type");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar6 = std::vector<Value_*,_std::allocator<Value_*>_>::size(&this->buffer_);
  sVar2 = index_local;
  if (sVar6 <= sVar1) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Index out of bounds");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVVar8 = std::vector<Value_*,_std::allocator<Value_*>_>::operator[](&this->buffer_,local_20);
  *ppVVar8 = (value_type)sVar2;
  return;
}

Assistant:

void ArrayValue::SetAtIndex(Value* value, size_t index) {
  if (value->GetType()->GetTypename() !=
      this->GetElementType()->GetTypename()) {
    throw std::runtime_error("Trying to set value of another type");
  } else if (index >= buffer_.size()) {
    throw std::runtime_error("Index out of bounds");
  } else {
    buffer_[index] = value;
  }
}